

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void SubtractionHelper<unsigned_int,_unsigned_char,_12>::
     SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (uint *lhs,uchar *rhs,uchar *result)

{
  if ((uint)*rhs <= *lhs) {
    SafeCastHelper<unsigned_char,_unsigned_int,_2>::
    CastThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(*lhs - (uint)*rhs,result);
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const T& lhs, const U& rhs, U& result ) SAFEINT_CPP_THROW
    {
        // both are unsigned - easy case
        if( rhs <= lhs )
        {
            T tmp = (T)(lhs - rhs);
            SafeCastHelper< U, T, GetCastMethod<U, T>::method >::template CastThrow<E>( tmp, result);
            return;
        }

        E::SafeIntOnOverflow();
    }